

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_utils.h
# Opt level: O0

int timeval_subtract(timeval *result,timeval *x,timeval *y)

{
  int iVar1;
  int iVar2;
  int nsec;
  int ret;
  timeval *y_local;
  timeval *x_local;
  timeval *result_local;
  
  iVar1 = timeval_comp(x,y);
  if (iVar1 < 1) {
    result->tv_sec = 0;
    result->tv_usec = 0;
    result_local._4_4_ = 1;
  }
  else {
    if (x->tv_usec < y->tv_usec) {
      iVar2 = (int)((y->tv_usec - x->tv_usec) / 1000000) + 1;
      y->tv_usec = y->tv_usec - (long)(iVar2 * 1000000);
      y->tv_sec = (long)iVar2 + y->tv_sec;
    }
    result->tv_sec = x->tv_sec - y->tv_sec;
    result->tv_usec = x->tv_usec - y->tv_usec;
    timeval_align(result);
    result_local._4_4_ = (uint)(iVar1 < 1);
  }
  return result_local._4_4_;
}

Assistant:

inline static int timeval_subtract(struct timeval *result, struct timeval *x,
                                   struct timeval *y) {
    int ret = timeval_comp(x, y);

    if (ret <= 0) {
        result->tv_sec = 0;
        result->tv_usec = 0;
        return 1;
    }

    // in case that tv_usec is unsigned -> perform the carry
    if (x->tv_usec < y->tv_usec) {
        int nsec = (y->tv_usec - x->tv_usec) / 1000000 + 1;
        y->tv_usec -= 1000000 * nsec;
        y->tv_sec += nsec;
    }

    /* Compute the time remaining to wait.
       tv_usec is certainly positive. */
    result->tv_sec = x->tv_sec - y->tv_sec;
    result->tv_usec = x->tv_usec - y->tv_usec;
    timeval_align(result);

    /* Return 1 if result is negative. */
    return ret <= 0;
}